

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::valtype<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  string local_90 [32];
  undefined1 local_70 [8];
  MaybeResult<wasm::Type> type;
  MaybeResult<wasm::Type> _val;
  
  tupletype<wasm::WATParser::ParseImplicitTypeDefsCtx>((MaybeResult<wasm::Type> *)local_70,ctx);
  if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70);
    singlevaltype<wasm::WATParser::ParseImplicitTypeDefsCtx>(__return_storage_ptr__,ctx);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70);
    if (_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                (local_90,(string *)
                          ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20))
      ;
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,local_90);
      std::__cxx11::string::~string(local_90);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_70;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (auto type = tupletype(ctx)) {
    CHECK_ERR(type);
    return *type;
  }
  return singlevaltype(ctx);
}